

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
* embree::SceneGraph::transformMSMBlurVectorVec3faBuffer<embree::Vec3fa>
            (vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             *__return_storage_ptr__,
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            *vectors_in,Transformations *spaces)

{
  float *pfVar1;
  Vector *pVVar2;
  Vector *pVVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  pointer pvVar7;
  pointer pvVar8;
  size_t sVar9;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar10;
  Vec3fa *pVVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  long lVar21;
  size_t sVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> local_98;
  AffineSpace3ff space;
  
  pvVar7 = (vectors_in->
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar8 = (vectors_in->
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar8 == pvVar7) {
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::vector(__return_storage_ptr__,vectors_in);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sVar9 = pvVar7->size_active;
    if ((long)pvVar8 - (long)pvVar7 == 0x20) {
      for (uVar23 = 0; uVar23 < (spaces->spaces).size_active; uVar23 = uVar23 + 1) {
        space.l.vy.field_0._8_8_ = 0;
        space.l.vx.field_0._8_8_ = 0;
        space.l.vy.field_0._0_8_ = 0;
        if (sVar9 != 0) {
          space.l.vy.field_0._8_8_ = alignedMalloc(sVar9 << 4,0x10);
          space.l.vy.field_0._0_8_ = sVar9;
        }
        lVar21 = 0;
        sVar22 = sVar9;
        while (bVar25 = sVar22 != 0, sVar22 = sVar22 - 1, bVar25) {
          pAVar10 = (spaces->spaces).items;
          pVVar11 = ((vectors_in->
                     super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start)->items;
          fVar4 = *(float *)((long)&pVVar11->field_0 + lVar21);
          fVar5 = *(float *)((long)&pVVar11->field_0 + lVar21 + 4);
          fVar6 = *(float *)((long)&pVVar11->field_0 + lVar21 + 8);
          pVVar2 = &pAVar10[uVar23].l.vz;
          fVar12 = (pVVar2->field_0).m128[1];
          fVar13 = (pVVar2->field_0).m128[2];
          fVar14 = (pVVar2->field_0).m128[3];
          pVVar3 = &pAVar10[uVar23].l.vy;
          fVar15 = (pVVar3->field_0).m128[1];
          fVar16 = (pVVar3->field_0).m128[2];
          fVar17 = (pVVar3->field_0).m128[3];
          pAVar10 = pAVar10 + uVar23;
          fVar18 = (pAVar10->l).vx.field_0.m128[1];
          fVar19 = (pAVar10->l).vx.field_0.m128[2];
          fVar20 = (pAVar10->l).vx.field_0.m128[3];
          pfVar1 = (float *)(space.l.vy.field_0._8_8_ + lVar21);
          *pfVar1 = fVar4 * (pAVar10->l).vx.field_0.m128[0] +
                    fVar5 * (pVVar3->field_0).m128[0] + fVar6 * (pVVar2->field_0).m128[0];
          pfVar1[1] = fVar4 * fVar18 + fVar5 * fVar15 + fVar6 * fVar12;
          pfVar1[2] = fVar4 * fVar19 + fVar5 * fVar16 + fVar6 * fVar13;
          pfVar1[3] = fVar4 * fVar20 + fVar5 * fVar17 + fVar6 * fVar14;
          lVar21 = lVar21 + 0x10;
        }
        space.l.vx.field_0._8_8_ = space.l.vy.field_0._0_8_;
        std::
        vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
        ::
        emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                  ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                    *)__return_storage_ptr__,
                   (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                   &space);
        alignedFree((void *)space.l.vy.field_0._8_8_);
      }
    }
    else {
      uVar23 = (long)pvVar8 - (long)pvVar7 >> 5;
      for (uVar24 = 0; uVar24 != uVar23; uVar24 = uVar24 + 1) {
        Transformations::interpolate(&space,spaces,(float)uVar24 / (float)(uVar23 - 1));
        local_98.items = (Vec3fa *)0x0;
        local_98.size_active = 0;
        local_98.size_alloced = 0;
        if (sVar9 != 0) {
          local_98.items = (Vec3fa *)alignedMalloc(sVar9 << 4,0x10);
          local_98.size_alloced = sVar9;
        }
        lVar21 = 0;
        sVar22 = sVar9;
        while (bVar25 = sVar22 != 0, sVar22 = sVar22 - 1, bVar25) {
          pVVar11 = (vectors_in->
                    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar24].items;
          fVar4 = *(float *)((long)&pVVar11->field_0 + lVar21);
          fVar5 = *(float *)((long)&pVVar11->field_0 + lVar21 + 4);
          fVar6 = *(float *)((long)&pVVar11->field_0 + lVar21 + 8);
          pfVar1 = (float *)((long)&(local_98.items)->field_0 + lVar21);
          *pfVar1 = fVar4 * space.l.vx.field_0.m128[0] +
                    fVar5 * space.l.vy.field_0.m128[0] + fVar6 * space.l.vz.field_0.m128[0];
          pfVar1[1] = fVar4 * space.l.vx.field_0.m128[1] +
                      fVar5 * space.l.vy.field_0.m128[1] + fVar6 * space.l.vz.field_0.m128[1];
          pfVar1[2] = fVar4 * space.l.vx.field_0.m128[2] +
                      fVar5 * space.l.vy.field_0.m128[2] + fVar6 * space.l.vz.field_0.m128[2];
          pfVar1[3] = fVar4 * space.l.vx.field_0.m128[3] +
                      fVar5 * space.l.vy.field_0.m128[3] + fVar6 * space.l.vz.field_0.m128[3];
          lVar21 = lVar21 + 0x10;
        }
        local_98.size_active = local_98.size_alloced;
        std::
        vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
        ::
        emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                  ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                    *)__return_storage_ptr__,&local_98);
        alignedFree(local_98.items);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<avector<Vertex>> transformMSMBlurVectorVec3faBuffer(const std::vector<avector<Vertex>>& vectors_in, const Transformations& spaces)
    {
      if (vectors_in.size() == 0)
        return vectors_in;
      
      std::vector<avector<Vertex>> vectors_out;
      const size_t num_time_steps = vectors_in.size();
      const size_t num_vertices = vectors_in[0].size();

      /* if we have only one set of vertices, use transformation to generate more vertex sets */
      if (num_time_steps == 1)
      {
        for (size_t i=0; i<spaces.size(); i++) 
        {
          avector<Vertex> vecs(num_vertices);
          for (size_t j=0; j<num_vertices; j++) {
            vecs[j] = xfmVector((AffineSpace3fa)spaces[i],vectors_in[0][j]);
          }
          vectors_out.push_back(std::move(vecs));
        }
      } 
      /* otherwise transform all vertex sets with interpolated transformation */
      else
      {
        for (size_t t=0; t<num_time_steps; t++) 
        {
          float time = num_time_steps > 1 ? float(t)/float(num_time_steps-1) : 0.0f;
          const AffineSpace3ff space = spaces.interpolate(time);
          avector<Vertex> vecs(num_vertices);
          for (size_t i=0; i<num_vertices; i++) {
            vecs[i] = xfmVector ((AffineSpace3fa)space,vectors_in[t][i]);
          }
          vectors_out.push_back(std::move(vecs));
        }
      }
      return vectors_out;
    }